

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O3

int main(int argc,char **argv)

{
  TidyDoc p_Var1;
  bool bVar2;
  FILE *__stream;
  Bool BVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  TidyDoc tdoc;
  ctmbstr ptVar7;
  char *pcVar8;
  ulong uVar9;
  ctmbstr ptVar10;
  int iVar11;
  TidyOptionId TVar12;
  char *pcVar13;
  FILE *__stream_00;
  TidyDoc p_Var14;
  char **ppcVar15;
  int iVar16;
  uint acclvl;
  uint wraplen;
  char local_51;
  char *local_48;
  uint local_40;
  uint local_3c;
  TidyDoc local_38;
  
  p_Var1 = (TidyDoc)*argv;
  tdoc = tidyCreate();
  tidySetMessageCallback(tdoc,reportCallback);
  errout = _stderr;
  BVar3 = tidyFileExists(tdoc,"/etc/tidy.conf");
  if ((BVar3 != no) &&
     (uVar4 = tidyLoadConfig(tdoc,"/etc/tidy.conf"), __stream = errout, uVar4 != 0)) {
    ptVar7 = tidyLocalizedString(0x310);
    fprintf((FILE *)__stream,ptVar7,"/etc/tidy.conf",(ulong)uVar4);
    fputc(10,(FILE *)errout);
  }
  pcVar8 = getenv("HTML_TIDY");
  local_38 = p_Var1;
  if (pcVar8 == (char *)0x0) {
    BVar3 = tidyFileExists(tdoc,"~/.tidyrc");
    if ((BVar3 == no) ||
       (uVar4 = tidyLoadConfig(tdoc,"~/.tidyrc"), __stream_00 = (FILE *)errout, uVar4 == 0))
    goto LAB_00130711;
    ptVar7 = tidyLocalizedString(0x310);
    pcVar8 = "~/.tidyrc";
  }
  else {
    uVar4 = tidyLoadConfig(tdoc,pcVar8);
    __stream_00 = (FILE *)errout;
    if (uVar4 == 0) goto LAB_00130711;
    ptVar7 = tidyLocalizedString(0x310);
  }
  fprintf(__stream_00,ptVar7,pcVar8,(ulong)uVar4);
  fputc(10,(FILE *)errout);
LAB_00130711:
  if (argc < 1) {
    iVar11 = 0;
    iVar16 = 0;
  }
  else {
    local_48 = (char *)0x0;
    iVar16 = 0;
    iVar11 = 0;
LAB_0013072f:
    do {
      ppcVar15 = argv + 1;
      if ((uint)argc < 2) {
        iVar5 = tidyParseStdin(tdoc);
        pcVar8 = "stdin";
      }
      else {
        pcVar8 = *ppcVar15;
        if (*pcVar8 == '-') {
          p_Var1 = (TidyDoc)(pcVar8 + 1);
          iVar5 = strcasecmp((char *)p_Var1,"xml");
          uVar4 = argc;
          if (iVar5 == 0) {
            TVar12 = TidyXmlTags;
LAB_00130ea9:
            BVar3 = yes;
LAB_00130eae:
            tidyOptSetBool(tdoc,TVar12,BVar3);
          }
          else {
            iVar5 = strcasecmp((char *)p_Var1,"asxml");
            if ((iVar5 == 0) || (iVar5 = strcasecmp((char *)p_Var1,"asxhtml"), iVar5 == 0)) {
              TVar12 = TidyXhtmlOut;
              goto LAB_00130ea9;
            }
            iVar5 = strcasecmp((char *)p_Var1,"ashtml");
            if (iVar5 == 0) {
              TVar12 = TidyHtmlOut;
              goto LAB_00130ea9;
            }
            iVar5 = strcasecmp((char *)p_Var1,"indent");
            if (iVar5 == 0) {
              tidyOptSetInt(tdoc,TidyIndentContent,2);
              uVar9 = tidyOptGetInt(tdoc,TidyIndentSpaces);
              if (uVar9 == 0) {
                tidyOptResetToDefault(tdoc,TidyIndentSpaces);
              }
              goto LAB_00130ebb;
            }
            iVar5 = strcasecmp((char *)p_Var1,"omit");
            if (iVar5 == 0) {
              TVar12 = TidyOmitOptionalTags;
              goto LAB_00130ea9;
            }
            iVar5 = strcasecmp((char *)p_Var1,"upper");
            if (iVar5 == 0) {
              TVar12 = TidyUpperCaseTags;
              goto LAB_00130ea9;
            }
            iVar5 = strcasecmp((char *)p_Var1,"clean");
            if (iVar5 == 0) {
              TVar12 = TidyMakeClean;
              goto LAB_00130ea9;
            }
            iVar5 = strcasecmp((char *)p_Var1,"gdoc");
            if (iVar5 == 0) {
              TVar12 = TidyGDocClean;
              goto LAB_00130ea9;
            }
            iVar5 = strcasecmp((char *)p_Var1,"bare");
            if (iVar5 == 0) {
              TVar12 = TidyMakeBare;
              goto LAB_00130ea9;
            }
            iVar5 = strcasecmp((char *)p_Var1,"raw");
            if (((((iVar5 == 0) || (iVar5 = strcasecmp((char *)p_Var1,"ascii"), iVar5 == 0)) ||
                 ((iVar5 = strcasecmp((char *)p_Var1,"latin0"), iVar5 == 0 ||
                  (((((iVar5 = strcasecmp((char *)p_Var1,"latin1"), iVar5 == 0 ||
                      (iVar5 = strcasecmp((char *)p_Var1,"utf8"), iVar5 == 0)) ||
                     (iVar5 = strcasecmp((char *)p_Var1,"iso2022"), iVar5 == 0)) ||
                    ((iVar5 = strcasecmp((char *)p_Var1,"utf16le"), iVar5 == 0 ||
                     (iVar5 = strcasecmp((char *)p_Var1,"utf16be"), iVar5 == 0)))) ||
                   (iVar5 = strcasecmp((char *)p_Var1,"utf16"), iVar5 == 0)))))) ||
                ((iVar5 = strcasecmp((char *)p_Var1,"shiftjis"), iVar5 == 0 ||
                 (iVar5 = strcasecmp((char *)p_Var1,"big5"), iVar5 == 0)))) ||
               ((iVar5 = strcasecmp((char *)p_Var1,"mac"), iVar5 == 0 ||
                ((iVar5 = strcasecmp((char *)p_Var1,"win1252"), iVar5 == 0 ||
                 (iVar5 = strcasecmp((char *)p_Var1,"ibm858"), iVar5 == 0)))))) {
              tidySetCharEncoding(tdoc,(ctmbstr)p_Var1);
              goto LAB_00130ebb;
            }
            iVar5 = strcasecmp((char *)p_Var1,"numeric");
            if (iVar5 == 0) {
              TVar12 = TidyNumEntities;
              goto LAB_00130ea9;
            }
            iVar5 = strcasecmp((char *)p_Var1,"modify");
            if (((iVar5 == 0) || (iVar5 = strcasecmp((char *)p_Var1,"change"), iVar5 == 0)) ||
               (iVar5 = strcasecmp((char *)p_Var1,"update"), iVar5 == 0)) {
              TVar12 = TidyWriteBack;
              goto LAB_00130ea9;
            }
            iVar5 = strcasecmp((char *)p_Var1,"errors");
            if (iVar5 == 0) {
              TVar12 = TidyShowMarkup;
              BVar3 = no;
              goto LAB_00130eae;
            }
            iVar5 = strcasecmp((char *)p_Var1,"quiet");
            if (iVar5 == 0) {
              TVar12 = TidyQuiet;
              goto LAB_00130ea9;
            }
            iVar5 = strcasecmp((char *)p_Var1,"language");
            if ((iVar5 == 0) || (iVar5 = strcasecmp((char *)p_Var1,"lang"), iVar5 == 0)) {
              if (argc != 2) {
                p_Var1 = (TidyDoc)argv[2];
                p_Var14 = p_Var1;
                iVar5 = strcasecmp((char *)p_Var1,"help");
                if (iVar5 == 0) {
                  lang_help(p_Var14);
                  exit(0);
                }
                BVar3 = tidySetLanguage((ctmbstr)p_Var1);
                if (BVar3 == no) {
                  ptVar7 = tidyLocalizedString(0x349);
                  pcVar8 = argv[2];
                  ptVar10 = tidyGetLanguage();
                  printf(ptVar7,pcVar8,ptVar10);
                  putchar(10);
                }
                goto LAB_001310dd;
              }
              ptVar7 = tidyLocalizedString(0x348);
              puts(ptVar7);
              uVar4 = 2;
              goto LAB_00130ebb;
            }
            ptVar7 = "help";
            iVar5 = strcasecmp((char *)p_Var1,"help");
            if (iVar5 == 0) {
LAB_001312f9:
              help(local_38,ptVar7);
LAB_00131396:
              tidyRelease(tdoc);
              return 0;
            }
            ptVar7 = "-help";
            iVar5 = strcasecmp((char *)p_Var1,"-help");
            if (iVar5 == 0) goto LAB_001312f9;
            ptVar7 = "h";
            iVar5 = strcasecmp((char *)p_Var1,"h");
            if ((iVar5 == 0) || (local_51 = (char)p_Var1->_opaque, local_51 == '?'))
            goto LAB_001312f9;
            iVar5 = strcasecmp((char *)p_Var1,"xml-help");
            if (iVar5 == 0) {
              xml_help();
              goto LAB_00131396;
            }
            p_Var14 = p_Var1;
            iVar5 = strcasecmp((char *)p_Var1,"xml-error-strings");
            if (iVar5 == 0) {
              xml_error_strings(p_Var14);
              goto LAB_00131396;
            }
            iVar5 = strcasecmp((char *)p_Var1,"xml-options-strings");
            if (iVar5 == 0) {
              xml_options_strings(tdoc);
              goto LAB_00131396;
            }
            iVar5 = strcasecmp((char *)p_Var1,"xml-strings");
            if (iVar5 == 0) {
              xml_strings();
              goto LAB_00131396;
            }
            iVar5 = strcasecmp((char *)p_Var1,"help-config");
            if (iVar5 == 0) {
              optionhelp(tdoc);
              goto LAB_00131396;
            }
            p_Var14 = p_Var1;
            iVar5 = strcasecmp((char *)p_Var1,"help-env");
            if (iVar5 == 0) {
              helpEnv(p_Var14);
              goto LAB_00131396;
            }
            iVar5 = strcasecmp((char *)p_Var1,"help-option");
            if (iVar5 == 0) {
              if (argc == 2) {
                ptVar7 = tidyLocalizedString(0x34a);
                puts(ptVar7);
              }
              else {
                optionDescribe(tdoc,argv[2]);
              }
              goto LAB_00131396;
            }
            iVar5 = strcasecmp((char *)p_Var1,"xml-config");
            if (iVar5 == 0) {
              XMLoptionhelp(tdoc);
              goto LAB_00131396;
            }
            iVar5 = strcasecmp((char *)p_Var1,"show-config");
            if (iVar5 == 0) {
              optionvalues(tdoc);
              goto LAB_00131396;
            }
            iVar5 = strcasecmp((char *)p_Var1,"export-config");
            if (iVar5 == 0) {
LAB_00131371:
              ForEachSortedOption(tdoc,printOptionExportValues);
              goto LAB_00131396;
            }
            iVar5 = strcasecmp((char *)p_Var1,"export-default-config");
            if (iVar5 == 0) {
              tidyOptResetAllToDefault(tdoc);
              goto LAB_00131371;
            }
            iVar5 = strcasecmp((char *)p_Var1,"config");
            if (iVar5 == 0) {
              uVar4 = 2;
              if (argc != 2) {
                tidyLoadConfig(tdoc,argv[2]);
LAB_00131069:
                ptVar7 = tidyOptGetValue(tdoc,TidyErrFile);
                if ((ptVar7 != (ctmbstr)0x0) &&
                   ((local_48 == (char *)0x0 || (iVar5 = strcmp(local_48,ptVar7), iVar5 != 0)))) {
                  errout = tidySetErrorFile(tdoc,ptVar7);
                  local_48 = ptVar7;
                }
LAB_001310dd:
                argv = ppcVar15;
                uVar4 = argc - 1;
              }
            }
            else {
              iVar5 = strcasecmp((char *)p_Var1,"output");
              if (((iVar5 == 0) || (iVar5 = strcasecmp((char *)p_Var1,"-output-file"), iVar5 == 0))
                 || (iVar5 = strcasecmp((char *)p_Var1,"o"), iVar5 == 0)) {
                uVar4 = 2;
                if (argc != 2) {
                  tidyOptSetValue(tdoc,TidyOutFile,argv[2]);
                  goto LAB_001310dd;
                }
              }
              else {
                iVar5 = strcasecmp((char *)p_Var1,"file");
                if (((iVar5 == 0) || (iVar5 = strcasecmp((char *)p_Var1,"-file"), iVar5 == 0)) ||
                   (iVar5 = strcasecmp((char *)p_Var1,"f"), iVar5 == 0)) {
                  uVar4 = 2;
                  if (argc != 2) {
                    local_48 = argv[2];
                    errout = tidySetErrorFile(tdoc,local_48);
                    goto LAB_001310dd;
                  }
                }
                else {
                  iVar5 = strcasecmp((char *)p_Var1,"wrap");
                  if (((iVar5 == 0) || (iVar5 = strcasecmp((char *)p_Var1,"-wrap"), iVar5 == 0)) ||
                     (iVar5 = strcasecmp((char *)p_Var1,"w"), iVar5 == 0)) {
                    uVar4 = 2;
                    if (argc != 2) {
                      local_3c = 0;
                      iVar5 = __isoc99_sscanf(argv[2],"%u",&local_3c);
                      TVar12 = TidyWrapLen;
                      uVar4 = local_3c;
LAB_00131126:
                      tidyOptSetInt(tdoc,TVar12,(ulong)uVar4);
                      if (0 < iVar5) {
                        argv = ppcVar15;
                      }
                      uVar4 = argc - (uint)(0 < iVar5);
                    }
                  }
                  else {
                    p_Var14 = p_Var1;
                    iVar5 = strcasecmp((char *)p_Var1,"version");
                    if (((iVar5 == 0) ||
                        (p_Var14 = p_Var1, iVar5 = strcasecmp((char *)p_Var1,"-version"), iVar5 == 0
                        )) || (p_Var14 = p_Var1, iVar5 = strcasecmp((char *)p_Var1,"v"), iVar5 == 0)
                       ) {
                      version(p_Var14);
                      goto LAB_00131396;
                    }
                    if (local_51 == '-') {
                      BVar3 = tidyOptParseValue(tdoc,pcVar8 + 2,argv[2]);
                      if (BVar3 != no) goto LAB_00131069;
                    }
                    else {
                      pcVar13 = "access";
                      iVar5 = strcasecmp((char *)p_Var1,"access");
                      if (iVar5 != 0) {
                        ptVar7 = pcVar8 + 2;
                        do {
                          switch(local_51) {
                          case 'b':
                            pcVar13 = (char *)0x2f;
                            break;
                          case 'c':
                            pcVar13 = (char *)0x30;
                            break;
                          case 'd':
                          case 'f':
                          case 'h':
                          case 'j':
                          case 'k':
                          case 'l':
                          case 'o':
                          case 'p':
                          case 'r':
                          case 's':
                          case 't':
                            goto switchD_00131180_caseD_64;
                          case 'e':
                            pcVar13 = (char *)0x4c;
                            BVar3 = no;
                            goto LAB_0013120a;
                          case 'g':
                            pcVar13 = (char *)0x1f;
                            break;
                          case 'i':
                            tidyOptSetInt(tdoc,TidyIndentContent,2);
                            pcVar13 = (char *)0x26;
                            uVar9 = tidyOptGetInt(tdoc,TidyIndentSpaces);
                            if (uVar9 == 0) {
                              pcVar13 = (char *)0x26;
                              tidyOptResetToDefault(tdoc,TidyIndentSpaces);
                            }
                            goto LAB_0013120f;
                          case 'm':
                            pcVar13 = (char *)0x61;
                            break;
                          case 'n':
                            pcVar13 = (char *)0x3a;
                            break;
                          case 'q':
                            pcVar13 = (char *)0x44;
                            break;
                          case 'u':
                            pcVar13 = (char *)0x55;
                            break;
                          default:
                            if (local_51 != '\0') {
switchD_00131180_caseD_64:
                              unknownOption((TidyDoc)(ulong)(uint)(int)local_51,(uint)pcVar13);
                              goto LAB_0013120f;
                            }
                            goto LAB_00130ebb;
                          }
                          BVar3 = yes;
LAB_0013120a:
                          tidyOptSetBool(tdoc,(TidyOptionId)pcVar13,BVar3);
LAB_0013120f:
                          local_51 = *ptVar7;
                          ptVar7 = ptVar7 + 1;
                        } while( true );
                      }
                      uVar4 = 2;
                      if (argc != 2) {
                        local_40 = 0;
                        iVar5 = __isoc99_sscanf(argv[2],"%u",&local_40);
                        TVar12 = TidyAccessibilityCheckLevel;
                        uVar4 = local_40;
                        goto LAB_00131126;
                      }
                    }
                  }
                }
              }
            }
          }
LAB_00130ebb:
          argc = uVar4 - 1;
          argv = argv + 1;
          if ((int)uVar4 < 2) break;
          goto LAB_0013072f;
        }
        BVar3 = tidyOptGetBool(tdoc,TidyShowFilename);
        if (BVar3 != no) {
          fprintf((FILE *)errout,"Tidy: \'%s\'",pcVar8);
          fputc(10,(FILE *)errout);
        }
        BVar3 = tidyOptGetBool(tdoc,TidyEmacs);
        if ((BVar3 != no) || (BVar3 = tidyOptGetBool(tdoc,TidyShowFilename), BVar3 != no)) {
          tidySetEmacsFile(tdoc,pcVar8);
        }
        iVar5 = tidyParseFile(tdoc,pcVar8);
      }
      if ((-1 < iVar5) && (iVar5 = tidyCleanAndRepair(tdoc), -1 < iVar5)) {
        iVar5 = tidyRunDiagnostics(tdoc);
        if (iVar5 < 2) {
          if (-1 < iVar5) goto LAB_001307ff;
        }
        else {
          BVar3 = tidyOptGetBool(tdoc,TidyForceOutput);
          if (BVar3 != no) {
LAB_001307ff:
            BVar3 = tidyOptGetBool(tdoc,TidyShowMarkup);
            if (BVar3 != no) {
              BVar3 = tidyOptGetBool(tdoc,TidyWriteBack);
              if ((((uint)argc < 2) || (BVar3 == no)) &&
                 (pcVar8 = tidyOptGetValue(tdoc,TidyOutFile), pcVar8 == (ctmbstr)0x0)) {
                tidySaveStdout(tdoc);
              }
              else {
                tidySaveFile(tdoc,pcVar8);
              }
            }
          }
        }
      }
      uVar6 = tidyErrorCount(tdoc);
      iVar11 = iVar11 + uVar6;
      uVar6 = tidyWarningCount(tdoc);
      iVar16 = iVar16 + uVar6;
      tidyAccessWarningCount(tdoc);
      bVar2 = 2 < argc;
      argc = argc - 1;
      argv = ppcVar15;
    } while (bVar2);
  }
  if ((iVar11 == 0 && errout == _stderr) && (BVar3 = tidyOptGetBool(tdoc,TidyQuiet), BVar3 == no)) {
    fputc(10,(FILE *)errout);
  }
  if (iVar11 + iVar16 != 0) {
    tidyErrorSummary(tdoc);
  }
  tidyGeneralInfo(tdoc);
  tidyRelease(tdoc);
  uVar4 = 2;
  if (iVar11 == 0) {
    uVar4 = (uint)(iVar16 != 0);
  }
  return uVar4;
}

Assistant:

int main( int argc, char** argv )
{
    ctmbstr prog = argv[0];
    ctmbstr cfgfil = NULL, errfil = NULL, htmlfil = NULL;
    TidyDoc tdoc = NULL;
    int status = 0;

    uint contentErrors = 0;
    uint contentWarnings = 0;
    uint accessWarnings = 0;

#if defined(ENABLE_DEBUG_LOG) && defined(_MSC_VER)
#  if defined(_CRTDBG_MAP_ALLOC)
    _CrtSetDbgFlag(_CRTDBG_ALLOC_MEM_DF | _CRTDBG_LEAK_CHECK_DF);
#  endif
#endif

    tdoc = tidyCreate();

    tidySetMessageCallback( tdoc, reportCallback); /* experimental group */
    errout = stderr;  /* initialize to stderr */

    /* Set an atexit handler. */
    atexit( tidy_cleanup );

#if defined(_WIN32)
    /* Force Windows console to use UTF, otherwise many characters will
     * be garbage. Note that East Asian languages *are* supported, but
     * only when Windows OS locale (not console only!) is set to an
     * East Asian language.
     */
    win_cp = GetConsoleOutputCP();
    SetConsoleOutputCP(CP_UTF8);
#endif

    /*
     * Look for default configuration files using any of
     * the following possibilities:
     *  - TIDY_CONFIG_FILE - from tidyplatform.h, typically /etc/tidy.conf
     *  - HTML_TIDY        - environment variable
     *  - TIDY_USER_CONFIG_FILE - from tidyplatform.h, typically ~/tidy.conf
     */

#ifdef TIDY_CONFIG_FILE
    if ( tidyFileExists( tdoc, TIDY_CONFIG_FILE) )
    {
        status = tidyLoadConfig( tdoc, TIDY_CONFIG_FILE );
        if ( status != 0 ) {
            fprintf(errout, tidyLocalizedString( TC_MAIN_ERROR_LOAD_CONFIG ), TIDY_CONFIG_FILE, status);
            fprintf(errout, "\n");
        }
    }
#endif /* TIDY_CONFIG_FILE */

    if ( (cfgfil = getenv("HTML_TIDY")) != NULL )
    {
        status = tidyLoadConfig( tdoc, cfgfil );
        if ( status != 0 ) {
            fprintf(errout, tidyLocalizedString( TC_MAIN_ERROR_LOAD_CONFIG ), cfgfil, status);
            fprintf(errout, "\n");
        }
    }
#ifdef TIDY_USER_CONFIG_FILE
    else if ( tidyFileExists( tdoc, TIDY_USER_CONFIG_FILE) )
    {
        status = tidyLoadConfig( tdoc, TIDY_USER_CONFIG_FILE );
        if ( status != 0 ) {
            fprintf(errout, tidyLocalizedString( TC_MAIN_ERROR_LOAD_CONFIG ), TIDY_USER_CONFIG_FILE, status);
            fprintf(errout, "\n");
        }
    }
#endif /* TIDY_USER_CONFIG_FILE */


    /*
     * Read command line
     */

    while ( argc > 0 )
    {
        if (argc > 1 && argv[1][0] == '-')
        {
            /* support -foo and --foo */
            ctmbstr arg = argv[1] + 1;

            if ( strcasecmp(arg, "xml") == 0)
                tidyOptSetBool( tdoc, TidyXmlTags, yes );

            else if ( strcasecmp(arg,   "asxml") == 0 ||
                     strcasecmp(arg, "asxhtml") == 0 )
            {
                tidyOptSetBool( tdoc, TidyXhtmlOut, yes );
            }
            else if ( strcasecmp(arg,   "ashtml") == 0 )
                tidyOptSetBool( tdoc, TidyHtmlOut, yes );

            else if ( strcasecmp(arg, "indent") == 0 )
            {
                tidyOptSetInt( tdoc, TidyIndentContent, TidyAutoState );
                if ( tidyOptGetInt(tdoc, TidyIndentSpaces) == 0 )
                    tidyOptResetToDefault( tdoc, TidyIndentSpaces );
            }
            else if ( strcasecmp(arg, "omit") == 0 )
                tidyOptSetBool( tdoc, TidyOmitOptionalTags, yes );

            else if ( strcasecmp(arg, "upper") == 0 )
                tidyOptSetBool( tdoc, TidyUpperCaseTags, yes );

            else if ( strcasecmp(arg, "clean") == 0 )
                tidyOptSetBool( tdoc, TidyMakeClean, yes );

            else if ( strcasecmp(arg, "gdoc") == 0 )
                tidyOptSetBool( tdoc, TidyGDocClean, yes );

            else if ( strcasecmp(arg, "bare") == 0 )
                tidyOptSetBool( tdoc, TidyMakeBare, yes );

            else if ( strcasecmp(arg, "raw") == 0     ||
                     strcasecmp(arg, "ascii") == 0    ||
                     strcasecmp(arg, "latin0") == 0   ||
                     strcasecmp(arg, "latin1") == 0   ||
                     strcasecmp(arg, "utf8") == 0     ||
#ifndef NO_NATIVE_ISO2022_SUPPORT
                     strcasecmp(arg, "iso2022") == 0  ||
#endif
                     strcasecmp(arg, "utf16le") == 0  ||
                     strcasecmp(arg, "utf16be") == 0  ||
                     strcasecmp(arg, "utf16") == 0    ||
                     strcasecmp(arg, "shiftjis") == 0 ||
                     strcasecmp(arg, "big5") == 0     ||
                     strcasecmp(arg, "mac") == 0      ||
                     strcasecmp(arg, "win1252") == 0  ||
                     strcasecmp(arg, "ibm858") == 0 )
            {
                tidySetCharEncoding( tdoc, arg );
            }
            else if ( strcasecmp(arg, "numeric") == 0 )
                tidyOptSetBool( tdoc, TidyNumEntities, yes );

            else if ( strcasecmp(arg, "modify") == 0 ||
                     strcasecmp(arg, "change") == 0 ||  /* obsolete */
                     strcasecmp(arg, "update") == 0 )   /* obsolete */
            {
                tidyOptSetBool( tdoc, TidyWriteBack, yes );
            }
            else if ( strcasecmp(arg, "errors") == 0 )
                tidyOptSetBool( tdoc, TidyShowMarkup, no );

            else if ( strcasecmp(arg, "quiet") == 0 )
                tidyOptSetBool( tdoc, TidyQuiet, yes );

            /* Currenly user must specify a language
             prior to anything that causes output */
            else if ( strcasecmp(arg, "language") == 0 ||
                     strcasecmp(arg,     "lang") == 0 )
                if ( argc >= 3)
                {
                    if ( strcasecmp(argv[2], "help") == 0 )
                    {
                        lang_help( tdoc );
                        exit(0);
                    }
                    if ( !tidySetLanguage( argv[2] ) )
                    {
                        printf(tidyLocalizedString(TC_STRING_LANG_NOT_FOUND),
                               argv[2], tidyGetLanguage());
                        printf("\n");
                    }
                    --argc;
                    ++argv;
                }
                else
                {
                    printf( "%s\n", tidyLocalizedString(TC_STRING_LANG_MUST_SPECIFY));
                }

            else if ( strcasecmp(arg, "help") == 0 ||
                        strcasecmp(arg, "-help") == 0 ||
                        strcasecmp(arg,    "h") == 0 || *arg == '?' )
            {
                help( tdoc, prog );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "xml-help") == 0)
            {
                xml_help( );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "xml-error-strings") == 0)
            {
                xml_error_strings( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "xml-options-strings") == 0)
            {
                xml_options_strings( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "xml-strings") == 0)
            {
                xml_strings( );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "help-config") == 0 )
            {
                optionhelp( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "help-env") == 0 )
            {
                helpEnv( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "help-option") == 0 )
            {
                if ( argc >= 3)
                {
                    optionDescribe( tdoc, argv[2] );
                }
                else
                {
                    printf( "%s\n", tidyLocalizedString(TC_STRING_MUST_SPECIFY));
                }
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "xml-config") == 0 )
            {
                XMLoptionhelp( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "show-config") == 0 )
            {
                optionvalues( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "export-config") == 0 )
            {
                exportOptionValues( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "export-default-config") == 0 )
            {
                exportDefaultOptionValues( tdoc );
                tidyRelease( tdoc );
                return 0; /* success */
            }
            else if ( strcasecmp(arg, "config") == 0 )
            {
                if ( argc >= 3 )
                {
                    ctmbstr post;

                    tidyLoadConfig( tdoc, argv[2] );

                    /* Set new error output stream if setting changed */
                    post = tidyOptGetValue( tdoc, TidyErrFile );
                    if ( post && (!errfil || !samefile(errfil, post)) )
                    {
                        errfil = post;
                        errout = tidySetErrorFile( tdoc, post );
                    }

                    --argc;
                    ++argv;
                }
            }

            else if ( strcasecmp(arg, "output") == 0 ||
                        strcasecmp(arg, "-output-file") == 0 ||
                        strcasecmp(arg, "o") == 0 )
            {
                if ( argc >= 3 )
                {
                    tidyOptSetValue( tdoc, TidyOutFile, argv[2] );
                    --argc;
                    ++argv;
                }
            }
            else if ( strcasecmp(arg,  "file") == 0 ||
                        strcasecmp(arg, "-file") == 0 ||
                        strcasecmp(arg,     "f") == 0 )
            {
                if ( argc >= 3 )
                {
                    errfil = argv[2];
                    errout = tidySetErrorFile( tdoc, errfil );
                    --argc;
                    ++argv;
                }
            }
            else if ( strcasecmp(arg,  "wrap") == 0 ||
                        strcasecmp(arg, "-wrap") == 0 ||
                        strcasecmp(arg,     "w") == 0 )
            {
                if ( argc >= 3 )
                {
                    uint wraplen = 0;
                    int nfields = sscanf( argv[2], "%u", &wraplen );
                    tidyOptSetInt( tdoc, TidyWrapLen, wraplen );
                    if (nfields > 0)
                    {
                        --argc;
                        ++argv;
                    }
                }
            }
            else if ( strcasecmp(arg,  "version") == 0 ||
                        strcasecmp(arg, "-version") == 0 ||
                        strcasecmp(arg,        "v") == 0 )
            {
                version( tdoc );
                tidyRelease( tdoc );
                return 0;  /* success */

            }
            else if ( strncmp(argv[1], "--", 2 ) == 0)
            {
                if ( tidyOptParseValue(tdoc, argv[1]+2, argv[2]) )
                {
                    /* Set new error output stream if setting changed */
                    ctmbstr post = tidyOptGetValue( tdoc, TidyErrFile );
                    if ( post && (!errfil || !samefile(errfil, post)) )
                    {
                        errfil = post;
                        errout = tidySetErrorFile( tdoc, post );
                    }

                    ++argv;
                    --argc;
                }
            }
                else if ( strcasecmp(arg, "access") == 0 )
                {
                    if ( argc >= 3 )
                    {
                        uint acclvl = 0;
                        int nfields = sscanf( argv[2], "%u", &acclvl );
                        tidyOptSetInt( tdoc, TidyAccessibilityCheckLevel, acclvl );
                        if (nfields > 0)
                        {
                            --argc;
                            ++argv;
                        }
                    }
                }

                else
                {
                    uint c;
                    ctmbstr s = argv[1];

                    while ( (c = *++s) != '\0' )
                    {
                        switch ( c )
                        {
                            case 'i':
                                tidyOptSetInt( tdoc, TidyIndentContent, TidyAutoState );
                                if ( tidyOptGetInt(tdoc, TidyIndentSpaces) == 0 )
                                    tidyOptResetToDefault( tdoc, TidyIndentSpaces );
                                break;

                            case 'u':
                                tidyOptSetBool( tdoc, TidyUpperCaseTags, yes );
                                break;

                            case 'c':
                                tidyOptSetBool( tdoc, TidyMakeClean, yes );
                                break;

                            case 'g':
                                tidyOptSetBool( tdoc, TidyGDocClean, yes );
                                break;

                            case 'b':
                                tidyOptSetBool( tdoc, TidyMakeBare, yes );
                                break;

                            case 'n':
                                tidyOptSetBool( tdoc, TidyNumEntities, yes );
                                break;

                            case 'm':
                                tidyOptSetBool( tdoc, TidyWriteBack, yes );
                                break;

                            case 'e':
                                tidyOptSetBool( tdoc, TidyShowMarkup, no );
                                break;

                            case 'q':
                                tidyOptSetBool( tdoc, TidyQuiet, yes );
                                break;

                            default:
                                unknownOption( tdoc, c );
                                break;
                        }
                    }
                }

            --argc;
            ++argv;
            continue;
        }


        if ( argc > 1 )
        {
            htmlfil = argv[1];
#ifdef ENABLE_DEBUG_LOG
            SPRTF("Tidy: '%s'\n", htmlfil);
#else /* !ENABLE_DEBUG_LOG */
            /* Is #713 - show-filename option */
            if (tidyOptGetBool(tdoc, TidyShowFilename))
            {
                fprintf(errout, "Tidy: '%s'", htmlfil);
                fprintf(errout, "\n");
            }
#endif /* ENABLE_DEBUG_LOG yes/no */
            if ( tidyOptGetBool(tdoc, TidyEmacs) || tidyOptGetBool(tdoc, TidyShowFilename))
                tidySetEmacsFile( tdoc, htmlfil );
            status = tidyParseFile( tdoc, htmlfil );
        }
        else
        {
            htmlfil = "stdin";
            status = tidyParseStdin( tdoc );
        }

        if ( status >= 0 )
            status = tidyCleanAndRepair( tdoc );

        if ( status >= 0 ) {
            status = tidyRunDiagnostics( tdoc );
        }
        if ( status > 1 ) /* If errors, do we want to force output? */
            status = ( tidyOptGetBool(tdoc, TidyForceOutput) ? status : -1 );

        if ( status >= 0 && tidyOptGetBool(tdoc, TidyShowMarkup) )
        {
            if ( tidyOptGetBool(tdoc, TidyWriteBack) && argc > 1 )
                status = tidySaveFile( tdoc, htmlfil );
            else
            {
                ctmbstr outfil = tidyOptGetValue( tdoc, TidyOutFile );
                if ( outfil ) {
                    status = tidySaveFile( tdoc, outfil );
                } else {
#ifdef ENABLE_DEBUG_LOG
                    static char tmp_buf[264];
                    sprintf(tmp_buf,"%s.html",get_log_file());
                    status = tidySaveFile( tdoc, tmp_buf );
                    SPRTF("Saved tidied content to '%s'\n",tmp_buf);
#else
                    status = tidySaveStdout( tdoc );
#endif
                }
            }
        }
        
        contentErrors   += tidyErrorCount( tdoc );
        contentWarnings += tidyWarningCount( tdoc );
        accessWarnings  += tidyAccessWarningCount( tdoc );
        
        --argc;
        ++argv;
        
        if ( argc <= 1 )
            break;
    } /* read command line loop */

    /* blank line for screen formatting */
    if ( errout == stderr && !contentErrors && !tidyOptGetBool( tdoc, TidyQuiet ) )
        fprintf(errout, "\n");

    /* footnote printing only if errors or warnings */
    if ( contentErrors + contentWarnings > 0 )
        tidyErrorSummary(tdoc);

    /* prints the general info, if applicable */
    tidyGeneralInfo(tdoc);

    /* called to free hash tables etc. */
    tidyRelease( tdoc );
    
    /* return status can be used by scripts */
    if ( contentErrors > 0 )
        return 2;
    
    if ( contentWarnings > 0 )
        return 1;
    
    /* 0 signifies all is ok */
    return 0;
}